

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint cacheId,bool isLoadMethod,bool isStore)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  ArenaAllocator *allocator;
  SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *local_88;
  SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *local_80;
  SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *rootObjectInlineCacheOffsets;
  size_t inlineCacheOffset;
  size_t offset;
  uchar uStack_27;
  byte local_26;
  byte local_25;
  undefined1 uStack_24;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  bool isStore_local;
  bool isLoadMethod_local;
  uint cacheId_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_26 = isStore;
  local_25 = isLoadMethod;
  _uStack_24 = cacheId;
  unique0x10000237 = value;
  if ((isLoadMethod) && (isStore)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x75b,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                    (&uStack_27,stack0xffffffffffffffe0);
  if ((bVar3) &&
     (bVar3 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_int,unsigned_int>
                        ((uint *)((long)&offset + 5),_uStack_24), bVar3)) {
    uVar4 = Data::EncodeT<(Js::LayoutSize)0>
                      (&this->m_byteCodeData,op,(void *)((long)&offset + 5),5,this);
    inlineCacheOffset = (size_t)uVar4;
    uVar4 = Data::GetCurrentOffset(&this->m_byteCodeData);
    sVar2 = inlineCacheOffset;
    uVar5 = OpCodeUtil::EncodedSize(op,SmallLayout);
    if ((ulong)uVar4 != sVar2 + uVar5 + 5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x761,
                                  "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>))"
                                  ,
                                  "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>)"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    sVar2 = inlineCacheOffset;
    uVar4 = OpCodeUtil::EncodedSize(op,SmallLayout);
    rootObjectInlineCacheOffsets =
         (SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)(sVar2 + uVar4);
    if ((local_26 & 1) == 0) {
      if ((local_25 & 1) == 0) {
        local_88 = &this->rootObjectLoadInlineCacheOffsets;
      }
      else {
        local_88 = &this->rootObjectLoadMethodInlineCacheOffsets;
      }
      local_80 = local_88;
    }
    else {
      local_80 = &this->rootObjectStoreInlineCacheOffsets;
    }
    allocator = JsUtil::
                List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::GetAllocator(this->m_labelOffsets);
    SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Prepend
              (local_80,allocator,(unsigned_long *)&rootObjectInlineCacheOffsets);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteElementRootCP(OpCode op, RegSlot value, uint cacheId, bool isLoadMethod, bool isStore)
    {
        Assert(!isLoadMethod || !isStore);
        OpLayoutT_ElementRootCP<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::Assign(layout.inlineCacheIndex, cacheId))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>));
            size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                + offsetof(OpLayoutT_ElementRootCP<SizePolicy>, inlineCacheIndex);

            // Root object inline cache index are given out from 0, but it will be at index after
            // all the plain inline cache. Store the offset of the inline cache index to patch it up later.
            SListBase<size_t> * rootObjectInlineCacheOffsets = isStore ?
                &rootObjectStoreInlineCacheOffsets : isLoadMethod ? &rootObjectLoadMethodInlineCacheOffsets : &rootObjectLoadInlineCacheOffsets;
            rootObjectInlineCacheOffsets->Prepend(this->m_labelOffsets->GetAllocator(), inlineCacheOffset);
            return true;
        }
        return false;
    }